

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O0

Node * __thiscall SplayTree::insert(SplayTree *this,int value,Node *root)

{
  Node *pNVar1;
  Node *local_28;
  Node *root_local;
  int value_local;
  SplayTree *this_local;
  
  if (insert::p_node == (Node *)0x0) {
    insert::p_node = newNode(this,value);
  }
  else {
    insert::p_node->value = value;
  }
  if (root == (Node *)0x0) {
    this_local = (SplayTree *)insert::p_node;
  }
  else {
    pNVar1 = splay(this,value,root);
    if (value < pNVar1->value) {
      insert::p_node->leftChild = pNVar1->leftChild;
      insert::p_node->rightChild = pNVar1;
      pNVar1->leftChild = (Node *)0x0;
      local_28 = insert::p_node;
    }
    else {
      if (value <= pNVar1->value) {
        return pNVar1;
      }
      insert::p_node->rightChild = pNVar1->rightChild;
      insert::p_node->leftChild = pNVar1;
      pNVar1->rightChild = (Node *)0x0;
      local_28 = insert::p_node;
    }
    this_local = (SplayTree *)local_28;
  }
  insert::p_node = (Node *)0x0;
  return (Node *)this_local;
}

Assistant:

SplayTree::Node *SplayTree::insert(int value, Node *root) {
    static Node *p_node = nullptr;
    if (!p_node) {
        p_node = newNode(value);
    } else {// could take advantage of the node remains because of there was duplicate key before.
        p_node->value = value;
    }
    if (!root) {
        root = p_node;
        p_node = nullptr;
        return root;
    }
    root = splay(value, root);
    /* This is BST that, all keys <= root->key is in root->lChild, all keys >
       root->key is in root->rChild. (This BST doesn't allow duplicate keys.) */
    if (value < root->value) {
        p_node->leftChild = root->leftChild;
        p_node->rightChild = root;
        root->leftChild = nullptr;
        root = p_node;
    } else if (value > root->value) {
        p_node->rightChild = root->rightChild;
        p_node->leftChild = root;
        root->rightChild = nullptr;
        root = p_node;
    } else {
        return root;
    }
    p_node = nullptr;
    return root;
}